

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

IReferenceCounters * __thiscall
Diligent::RefCountedObject<Diligent::ITopLevelASVk>::GetReferenceCounters
          (RefCountedObject<Diligent::ITopLevelASVk> *this)

{
  Char *Message;
  char (*in_RCX) [26];
  undefined1 local_30 [8];
  string msg;
  RefCountedObject<Diligent::ITopLevelASVk> *this_local;
  
  if (this->m_pRefCounters == (RefCountersImpl *)0x0) {
    msg.field_2._8_8_ = this;
    FormatString<char[26],char[26]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetReferenceCounters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x21b);
    std::__cxx11::string::~string((string *)local_30);
  }
  return &this->m_pRefCounters->super_IReferenceCounters;
}

Assistant:

GetReferenceCounters() const override final
    {
        VERIFY_EXPR(m_pRefCounters != nullptr);
        return m_pRefCounters;
    }